

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hint_source.cpp
# Opt level: O2

void __thiscall
HintSource::HintSource
          (HintSource *this,vector<unsigned_short,_std::allocator<unsigned_short>_> *text_ids,
          string *description,WorldNode *node,bool small_textbox,
          vector<unsigned_short,_std::allocator<unsigned_short>_> *map_ids,Position position,
          uint8_t orientation,bool high_palette)

{
  pointer puVar1;
  undefined4 uVar2;
  
  this->_vptr_HintSource = (_func_int **)&PTR_to_json_abi_cxx11__00246608;
  puVar1 = (text_ids->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  (this->_text_ids).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_start =
       (text_ids->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>)._M_impl.
       super__Vector_impl_data._M_start;
  (this->_text_ids).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_finish = puVar1;
  (this->_text_ids).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (text_ids->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>)._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (text_ids->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (text_ids->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (text_ids->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string(&this->_description,description);
  this->_node = node;
  this->_small_textbox = small_textbox;
  (this->_text)._M_dataplus._M_p = (pointer)&(this->_text).field_2;
  (this->_text)._M_string_length = 0;
  (this->_text).field_2._M_local_buf[0] = '\0';
  puVar1 = (map_ids->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  (this->_map_ids).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_start =
       (map_ids->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>)._M_impl.
       super__Vector_impl_data._M_start;
  (this->_map_ids).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_finish = puVar1;
  (this->_map_ids).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (map_ids->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>)._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (map_ids->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (map_ids->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (map_ids->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_position).half_y = (bool)(char)position._4_2_;
  (this->_position).half_z = (bool)(char)((ushort)position._4_2_ >> 8);
  uVar2 = position._0_4_;
  (this->_position).x = (char)uVar2;
  (this->_position).y = (char)((uint)uVar2 >> 8);
  (this->_position).z = (char)((uint)uVar2 >> 0x10);
  (this->_position).half_x = (bool)(char)((uint)uVar2 >> 0x18);
  this->_orientation = orientation;
  this->_high_palette = high_palette;
  return;
}

Assistant:

HintSource::HintSource(std::vector<uint16_t> text_ids, std::string description,
        WorldNode* node, bool small_textbox,
        std::vector<uint16_t> map_ids, Position position, uint8_t orientation, bool high_palette) :
    _text_ids       (std::move(text_ids)),
    _description    (std::move(description)),
    _node           (node),
    _small_textbox  (small_textbox),
    _map_ids        (std::move(map_ids)),
    _position       (position),
    _orientation    (orientation),
    _high_palette   (high_palette)
{}